

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

bool HasMatchingArgumentNames
               (ArrayView<ArgumentData> *functionArguments,ArrayView<ArgumentData> arguments)

{
  SynIdentifier *pSVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  InplaceStr functionArgumentName;
  InplaceStr argumentName;
  InplaceStr local_58;
  InplaceStr local_48;
  
  if (arguments.count != 0) {
    uVar5 = arguments._8_8_ & 0xffffffff;
    uVar7 = 0;
    bVar9 = false;
    do {
      pSVar1 = arguments.data[uVar7].name;
      if (pSVar1 != (SynIdentifier *)0x0) {
        local_48.begin = (pSVar1->name).begin;
        local_48.end = (pSVar1->name).end;
        uVar4 = functionArguments->count;
        if (uVar4 == 0) {
          return bVar9;
        }
        lVar6 = 0x10;
        uVar8 = 0;
        do {
          lVar2 = *(long *)((long)&functionArguments->data->source + lVar6);
          if (lVar2 != 0) {
            local_58.begin = *(char **)(lVar2 + 0x40);
            local_58.end = *(char **)(lVar2 + 0x48);
            bVar3 = InplaceStr::operator==(&local_58,&local_48);
            if (bVar3) break;
            uVar4 = functionArguments->count;
          }
          uVar8 = uVar8 + 1;
          lVar6 = lVar6 + 0x30;
          if (uVar4 <= uVar8) {
            return bVar9;
          }
        } while( true );
      }
      uVar7 = uVar7 + 1;
      bVar9 = uVar5 <= uVar7;
    } while (uVar7 != uVar5);
  }
  return true;
}

Assistant:

bool HasMatchingArgumentNames(ArrayView<ArgumentData> &functionArguments, ArrayView<ArgumentData> arguments)
{
	for(unsigned i = 0, e = arguments.count; i < e; i++)
	{
		if(!arguments.data[i].name)
			continue;

		InplaceStr argumentName = arguments.data[i].name->name;

		bool found = false;

		for(unsigned k = 0; k < functionArguments.count; k++)
		{
			if(!functionArguments.data[k].name)
				continue;

			InplaceStr functionArgumentName = functionArguments.data[k].name->name;

			if(functionArgumentName == argumentName)
			{
				found = true;
				break;
			}
		}

		if(!found)
			return false;
	}

	return true;
}